

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O0

int sha256_done(sha256_state *md,uchar *out)

{
  uint uVar1;
  int local_24;
  int i;
  uchar *out_local;
  sha256_state *md_local;
  
  if (md == (sha256_state *)0x0) {
    md_local._4_4_ = -1;
  }
  else if (out == (uchar *)0x0) {
    md_local._4_4_ = -1;
  }
  else if (md->curlen < 0x40) {
    md->length = (ulong)(md->curlen << 3) + md->length;
    uVar1 = md->curlen;
    md->curlen = uVar1 + 1;
    md->buf[uVar1] = 0x80;
    if (0x38 < md->curlen) {
      while (md->curlen < 0x40) {
        uVar1 = md->curlen;
        md->curlen = uVar1 + 1;
        md->buf[uVar1] = '\0';
      }
      s_sha256_compress(md,md->buf);
      md->curlen = 0;
    }
    while (md->curlen < 0x38) {
      uVar1 = md->curlen;
      md->curlen = uVar1 + 1;
      md->buf[uVar1] = '\0';
    }
    md->buf[0x38] = (uchar)(md->length >> 0x38);
    md->buf[0x39] = (uchar)(md->length >> 0x30);
    md->buf[0x3a] = (uchar)(md->length >> 0x28);
    md->buf[0x3b] = (uchar)(md->length >> 0x20);
    md->buf[0x3c] = (uchar)(md->length >> 0x18);
    md->buf[0x3d] = (uchar)(md->length >> 0x10);
    md->buf[0x3e] = (uchar)(md->length >> 8);
    md->buf[0x3f] = (uchar)md->length;
    s_sha256_compress(md,md->buf);
    for (local_24 = 0; local_24 < 8; local_24 = local_24 + 1) {
      out[local_24 << 2] = (uchar)(md->state[local_24] >> 0x18);
      out[(long)(local_24 << 2) + 1] = (uchar)(md->state[local_24] >> 0x10);
      out[(long)(local_24 << 2) + 2] = (uchar)(md->state[local_24] >> 8);
      out[(long)(local_24 << 2) + 3] = (uchar)md->state[local_24];
    }
    md_local._4_4_ = 0;
  }
  else {
    md_local._4_4_ = -1;
  }
  return md_local._4_4_;
}

Assistant:

static int sha256_done(struct sha256_state * md, unsigned char *out)
{
    int i;

    if (md == NULL) return -1;
    if (out == NULL) return -1;

    if (md->curlen >= sizeof(md->buf)) {
       return -1;
    }

    /* increase the length of the message */
    md->length += md->curlen * 8;

    /* append the '1' bit */
    md->buf[md->curlen++] = (unsigned char)0x80;

    /* if the length is currently above 56 bytes we append zeros
     * then compress.  Then we can fall back to padding zeros and length
     * encoding like normal.
     */
    if (md->curlen > 56) {
        while (md->curlen < 64) {
            md->buf[md->curlen++] = (unsigned char)0;
        }
        s_sha256_compress(md, md->buf);
        md->curlen = 0;
    }

    /* pad upto 56 bytes of zeroes */
    while (md->curlen < 56) {
        md->buf[md->curlen++] = (unsigned char)0;
    }

    /* store length */
    STORE64H(md->length, md->buf+56);
    s_sha256_compress(md, md->buf);

    /* copy output */
    for (i = 0; i < 8; i++) {
        STORE32H(md->state[i], out+(4*i));
    }
    return 0;
}